

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::ADC_AB_X(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  
  this->cycles = 4;
  bVar6 = this->A;
  uVar2 = GetWord(this);
  this->cycles = this->cycles - 1;
  uVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(ushort)(this->X + uVar2));
  uVar4 = ((this->field_6).ps & 1) + (uint)this->A + (uVar3 & 0xff);
  bVar1 = (byte)uVar4;
  this->A = bVar1;
  uVar5 = bVar6 & 0xffffff80;
  bVar6 = ((bVar1 & 0x80) != (byte)uVar5) << 6;
  if ((uVar3 & 0x80) != uVar5) {
    bVar6 = 0;
  }
  (this->field_6).ps =
       (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x3c | 0xff < uVar4 | bVar6 | bVar1 & 0x80;
  return;
}

Assistant:

void CPU::ADC_AB_X()
{
    cycles = 4;
    uint8_t acp = A, op = ReadByte(GetWord() + X);
    uint16_t sum = A + op + C;
    A = (sum & 0xFF);
    C = (sum & 0xFF00) > 0;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
    V = (((acp & 0b10000000) ^ (op & 0b10000000)) == 0) ? (A & 0b10000000) != (acp & 0b10000000) : 0;
}